

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O1

bool tinyusdz::detail::ParseValue<std::array<float,4ul>>
               (AsciiParser *parser,float4 *ret,string *err)

{
  ostringstream *poVar1;
  bool bVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  unsigned_long *in_R8;
  vector<float,_std::allocator<float>_> values;
  ostringstream ss_e;
  string local_228;
  vector<float,_std::allocator<float>_> local_208;
  string local_1f0;
  long *local_1d0 [2];
  long local_1c0 [2];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar2 = ascii::AsciiParser::SepBy1BasicType<float>(parser,',',&local_208);
  if (bVar2) {
    if ((long)local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start == 0x10) {
      ret->_M_elems[0] =
           *local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
      ret->_M_elems[1] =
           local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[1];
      ret->_M_elems[2] =
           local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[2];
      ret->_M_elems[3] =
           local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[3];
      bVar2 = true;
      goto LAB_002d7d79;
    }
    poVar1 = (ostringstream *)(local_1b0 + 8);
    ::std::__cxx11::ostringstream::ostringstream(poVar1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc",
               0x51);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ParseValue",10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(poVar1,0x129);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_1d0[0] = local_1c0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,"type `{}` expects the number of elements is 4, but got {}","");
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    local_1f0.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
    local_1f0.field_2._M_allocated_capacity._4_2_ = 0x3474;
    local_1f0._M_string_length = 6;
    local_1f0.field_2._M_local_buf[6] = '\0';
    local_1b0._0_8_ =
         (long)local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start >> 2;
    fmt::format<std::__cxx11::string,unsigned_long>
              ((string *)&local_228,(fmt *)local_1d0,(string *)&local_1f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,in_R8)
    ;
  }
  else {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    ::std::__cxx11::ostringstream::ostringstream(poVar1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc",
               0x51);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ParseValue",10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(poVar1,0x123);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_1d0[0] = local_1c0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,"Failed to parse a value of type `{}`","");
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    local_1f0.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
    local_1f0.field_2._M_allocated_capacity._4_2_ = 0x3474;
    local_1f0._M_string_length = 6;
    local_1f0.field_2._M_local_buf[6] = '\0';
    fmt::format<std::__cxx11::string>(&local_228,(fmt *)local_1d0,&local_1f0,in_RCX);
  }
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)(local_1b0 + 8),local_228._M_dataplus._M_p,
                      local_228._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,
                    CONCAT17(local_1f0.field_2._M_local_buf[7],
                             CONCAT16(local_1f0.field_2._M_local_buf[6],
                                      CONCAT24(local_1f0.field_2._M_allocated_capacity._4_2_,
                                               local_1f0.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  if (err != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)err,(ulong)local_228._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  ::std::ios_base::~ios_base(local_138);
  bVar2 = false;
LAB_002d7d79:
  if (local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool ParseValue<value::float4>(tinyusdz::ascii::AsciiParser &parser,
                               value::float4 &ret, std::string *err) {
  std::vector<float> values;
  if (!parser.SepBy1BasicType(',', &values)) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Failed to parse a value of type `{}`",
                    value::TypeTraits<value::float4>::type_name()));
  }

  if (values.size() != 4) {
    PUSH_ERROR_AND_RETURN(fmt::format(
        "type `{}` expects the number of elements is 4, but got {}",
        value::TypeTraits<value::float4>::type_name(), values.size()));
  }

  ret[0] = values[0];
  ret[1] = values[1];
  ret[2] = values[2];
  ret[3] = values[3];

  return true;
}